

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

void __thiscall vmips::Binary::output(Binary *this,ostream *out)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  char *__s;
  
  iVar1 = (*(this->super_Instruction)._vptr_Instruction[1])();
  __s = (char *)CONCAT44(extraout_var,iVar1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  operator<<(out,(this->lhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  operator<<(out,(this->rhs).super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void Binary::output(std::ostream &out) const {
    out << name() << " " << *lhs << ", " << *rhs;
}